

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O2

FuncValue * __thiscall
asmjit::v1_14::FuncDetail::arg(FuncDetail *this,size_t argIndex,size_t valueIndex)

{
  FuncValue *pFVar1;
  
  if (argIndex < 0x20) {
    pFVar1 = FuncValuePack::operator[]((FuncValuePack *)(this + argIndex * 0x10 + 0x9c),valueIndex);
    return pFVar1;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/../core/func.h"
             ,0x3af,"argIndex < Globals::kMaxFuncArgs");
}

Assistant:

inline const FuncValue& arg(size_t argIndex, size_t valueIndex = 0) const noexcept {
    ASMJIT_ASSERT(argIndex < Globals::kMaxFuncArgs);
    return _args[argIndex][valueIndex];
  }